

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_> * __thiscall
de::SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_>::operator=
          (SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_> *this,
          SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_> *other)

{
  SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_> *other_local;
  SharedPtr<vk::refdetails::Unique<vk::VkDevice_s_*>_> *this_local;
  
  if (this->m_state != other->m_state) {
    release(this);
    this->m_ptr = other->m_ptr;
    this->m_state = other->m_state;
    acquire(this);
  }
  return this;
}

Assistant:

inline SharedPtr<T>& SharedPtr<T>::operator= (const SharedPtr<T>& other)
{
	if (m_state == other.m_state)
		return *this;

	// Release current reference.
	release();

	// Copy from other and acquire reference.
	m_ptr	= other.m_ptr;
	m_state	= other.m_state;

	acquire();

	return *this;
}